

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall Uniforms::set(Uniforms *this,string *_name,float _x,float _y,float _z,float _w)

{
  mapped_type *this_00;
  UniformValue value;
  UniformValue local_20;
  
  local_20._M_elems[0] = _x;
  local_20._M_elems[1] = _y;
  local_20._M_elems[2] = _z;
  local_20._M_elems[3] = _w;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,&local_20,4,false,true);
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set(const std::string& _name, float _x, float _y, float _z, float _w) {
    UniformValue value;
    value[0] = _x;
    value[1] = _y;
    value[2] = _z;
    value[3] = _w;
    data[_name].set(value, 4, false);
    m_change = true;
}